

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

string * muduo::ProcessInfo::exePath_abi_cxx11_(void)

{
  ssize_t sVar1;
  string *in_RDI;
  ssize_t n;
  char buf [1024];
  string *result;
  char local_418 [1039];
  undefined1 local_9;
  
  local_9 = 0;
  std::__cxx11::string::string(in_RDI);
  sVar1 = readlink("/proc/self/exe",local_418,0x400);
  if (0 < sVar1) {
    std::__cxx11::string::assign((char *)in_RDI,(ulong)local_418);
  }
  return in_RDI;
}

Assistant:

string ProcessInfo::exePath()
{
  string result;
  char buf[1024];
  ssize_t n = ::readlink("/proc/self/exe", buf, sizeof buf);
  if (n > 0)
  {
    result.assign(buf, n);
  }
  return result;
}